

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int unixAccess(sqlite3_vfs *NotUsed,char *zPath,int flags,int *pResOut)

{
  int iVar1;
  bool local_ba;
  bool local_b9;
  undefined1 local_b8 [8];
  stat buf;
  int *pResOut_local;
  int flags_local;
  char *zPath_local;
  sqlite3_vfs *NotUsed_local;
  
  buf.__glibc_reserved[2] = (__syscall_slong_t)pResOut;
  if (flags == 0) {
    iVar1 = (*aSyscall[4].pCurrent)(zPath,local_b8);
    local_b9 = false;
    if (iVar1 == 0) {
      local_ba = ((uint)buf.st_nlink & 0xf000) != 0x8000 || 0 < (long)buf.st_rdev;
      local_b9 = local_ba;
    }
    *(uint *)buf.__glibc_reserved[2] = (uint)local_b9;
  }
  else {
    iVar1 = (*aSyscall[2].pCurrent)(zPath,6);
    *(uint *)buf.__glibc_reserved[2] = (uint)(iVar1 == 0);
  }
  return 0;
}

Assistant:

static int unixAccess(
  sqlite3_vfs *NotUsed,   /* The VFS containing this xAccess method */
  const char *zPath,      /* Path of the file to examine */
  int flags,              /* What do we want to learn about the zPath file? */
  int *pResOut            /* Write result boolean here */
){
  UNUSED_PARAMETER(NotUsed);
  SimulateIOError( return SQLITE_IOERR_ACCESS; );
  assert( pResOut!=0 );

  /* The spec says there are three possible values for flags.  But only
  ** two of them are actually used */
  assert( flags==SQLITE_ACCESS_EXISTS || flags==SQLITE_ACCESS_READWRITE );

  if( flags==SQLITE_ACCESS_EXISTS ){
    struct stat buf;
    *pResOut = 0==osStat(zPath, &buf) &&
                (!S_ISREG(buf.st_mode) || buf.st_size>0);
  }else{
    *pResOut = osAccess(zPath, W_OK|R_OK)==0;
  }
  return SQLITE_OK;
}